

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

IGUIImageList * __thiscall
irr::gui::CGUIEnvironment::createImageList
          (CGUIEnvironment *this,ITexture *texture,dimension2d<int> imageSize,bool useAlphaChannel)

{
  dimension2d<int> imageSize_00;
  bool bVar1;
  undefined1 in_CL;
  ITexture *in_RDX;
  int in_ESI;
  IReferenceCounted *in_RDI;
  CGUIImageList *imageList;
  IVideoDriver *in_stack_ffffffffffffffc8;
  CGUIImageList *in_stack_ffffffffffffffd0;
  undefined3 in_stack_ffffffffffffffdc;
  uint uVar2;
  CGUIImageList *local_8;
  
  uVar2 = CONCAT13(in_CL,in_stack_ffffffffffffffdc) & 0x1ffffff;
  local_8 = (CGUIImageList *)operator_new(0x48);
  CGUIImageList::CGUIImageList(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  imageSize_00.Height = in_ESI;
  imageSize_00.Width = uVar2;
  bVar1 = CGUIImageList::createImageList
                    (local_8,in_RDX,imageSize_00,SUB81((ulong)local_8 >> 0x38,0));
  if (!bVar1) {
    IReferenceCounted::drop(in_RDI);
    local_8 = (CGUIImageList *)0x0;
  }
  return &local_8->super_IGUIImageList;
}

Assistant:

IGUIImageList *CGUIEnvironment::createImageList(video::ITexture *texture,
		core::dimension2d<s32> imageSize, bool useAlphaChannel)
{
	CGUIImageList *imageList = new CGUIImageList(Driver);
	if (!imageList->createImageList(texture, imageSize, useAlphaChannel)) {
		imageList->drop();
		return 0;
	}

	return imageList;
}